

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O2

int SetRudderThrustersFluxPololu
              (POLOLU *pPololu,double angle,double urt,double ult,double urf,double ulf)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int pws [24];
  int selectedchannels [24];
  
  selectedchannels[0] = 0;
  selectedchannels[1] = 0;
  selectedchannels[2] = 0;
  selectedchannels[3] = 0;
  selectedchannels[4] = 0;
  selectedchannels[5] = 0;
  selectedchannels[6] = 0;
  selectedchannels[7] = 0;
  selectedchannels[8] = 0;
  selectedchannels[9] = 0;
  selectedchannels[10] = 0;
  selectedchannels[0xb] = 0;
  selectedchannels[0xc] = 0;
  selectedchannels[0xd] = 0;
  selectedchannels[0xe] = 0;
  selectedchannels[0xf] = 0;
  selectedchannels[0x10] = 0;
  selectedchannels[0x11] = 0;
  selectedchannels[0x12] = 0;
  selectedchannels[0x13] = 0;
  selectedchannels[0x14] = 0;
  selectedchannels[0x15] = 0;
  selectedchannels[0x16] = 0;
  selectedchannels[0x17] = 0;
  pws[0] = 0;
  pws[1] = 0;
  pws[2] = 0;
  pws[3] = 0;
  pws[4] = 0;
  pws[5] = 0;
  pws[6] = 0;
  pws[7] = 0;
  pws[8] = 0;
  pws[9] = 0;
  pws[10] = 0;
  pws[0xb] = 0;
  pws[0xc] = 0;
  pws[0xd] = 0;
  pws[0xe] = 0;
  pws[0xf] = 0;
  pws[0x10] = 0;
  pws[0x11] = 0;
  pws[0x12] = 0;
  pws[0x13] = 0;
  pws[0x14] = 0;
  pws[0x15] = 0;
  pws[0x16] = 0;
  pws[0x17] = 0;
  dVar1 = pPololu->MidAngle;
  if (0.0 <= angle) {
    dVar8 = pPololu->MinAngle;
    dVar10 = pPololu->MaxAngle;
    dVar11 = dVar10 - dVar1;
  }
  else {
    dVar8 = pPololu->MinAngle;
    dVar10 = pPololu->MaxAngle;
    dVar11 = dVar1 - dVar8;
  }
  dVar10 = ABS(dVar10);
  dVar12 = ABS(dVar8);
  if (ABS(dVar8) <= dVar10) {
    dVar12 = dVar10;
  }
  dVar9 = ABS(dVar8);
  if (ABS(dVar8) <= dVar10) {
    dVar9 = dVar10;
  }
  iVar6 = pPololu->rudderchan;
  pws[iVar6] = (int)(((dVar1 + (dVar11 * angle) / dVar12) * 500.0) / dVar9) + 0x5dc;
  iVar2 = pPololu->rightthrusterchan;
  pws[iVar2] = (int)(urt * 1000.0 * 0.5) + 0x5dc;
  iVar3 = pPololu->leftthrusterchan;
  pws[iVar3] = (int)(ult * 1000.0 * 0.5) + 0x5dc;
  iVar4 = pPololu->rightfluxchan;
  pws[iVar4] = (int)(urf * 1000.0 * 0.5) + 0x5dc;
  iVar5 = pPololu->leftfluxchan;
  pws[iVar5] = (int)(ulf * 1000.0 * 0.5) + 0x5dc;
  iVar7 = pws[iVar6];
  if (1999 < iVar7) {
    iVar7 = 2000;
  }
  if (iVar7 < 0x3e9) {
    iVar7 = 1000;
  }
  pws[iVar6] = iVar7;
  iVar7 = pws[iVar2];
  if (1999 < iVar7) {
    iVar7 = 2000;
  }
  if (iVar7 < 0x3e9) {
    iVar7 = 1000;
  }
  pws[iVar2] = iVar7;
  iVar7 = pws[iVar3];
  if (1999 < iVar7) {
    iVar7 = 2000;
  }
  if (iVar7 < 0x3e9) {
    iVar7 = 1000;
  }
  pws[iVar3] = iVar7;
  iVar7 = pws[iVar4];
  if (1999 < iVar7) {
    iVar7 = 2000;
  }
  if (iVar7 < 0x3e9) {
    iVar7 = 1000;
  }
  pws[iVar4] = iVar7;
  iVar7 = 2000;
  if (pws[iVar5] < 2000) {
    iVar7 = pws[iVar5];
  }
  if (iVar7 < 0x3e9) {
    iVar7 = 1000;
  }
  pws[iVar5] = iVar7;
  selectedchannels[iVar6] = 1;
  selectedchannels[iVar2] = 1;
  selectedchannels[iVar3] = 1;
  selectedchannels[iVar4] = 1;
  selectedchannels[iVar5] = 1;
  iVar6 = SetAllPWMsPololu(pPololu,selectedchannels,pws);
  return iVar6;
}

Assistant:

inline int SetRudderThrustersFluxPololu(POLOLU* pPololu, double angle, double urt, double ult, double urf, double ulf)
{
	int selectedchannels[NB_CHANNELS_PWM_POLOLU];
	int pws[NB_CHANNELS_PWM_POLOLU];
#ifndef DISABLE_RUDDER_MIDANGLE
	double angletmp = 0;
#endif // DISABLE_RUDDER_MIDANGLE

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(pws, 0, sizeof(pws));

	// Convert angle (in rad) into Pololu pulse width (in us).
#ifndef DISABLE_RUDDER_MIDANGLE
	angletmp = angle >= 0? pPololu->MidAngle+angle*(pPololu->MaxAngle-pPololu->MidAngle)/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)): pPololu->MidAngle+angle*(pPololu->MidAngle-pPololu->MinAngle)/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle));
	//angletmp = angle >= 0? pPololu->MidAngle+urudder*(pPololu->MaxAngle-pPololu->MidAngle): pPololu->MidAngle+urudder*(pPololu->MidAngle-pPololu->MinAngle);
	if (angletmp >= 0)
		pws[pPololu->rudderchan] = DEFAULT_MID_PW_POLOLU+(int)(angletmp*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU)
			/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)));
	else
		pws[pPololu->rudderchan] = DEFAULT_MID_PW_POLOLU+(int)(angletmp*(DEFAULT_MID_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)
			/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)));
#else
	pws[pPololu->rudderchan] = DEFAULT_MID_PW_POLOLU+(int)(angle*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)
		/(pPololu->MaxAngle-pPololu->MinAngle));
#endif // DISABLE_RUDDER_MIDANGLE
	// Convert u (in [-1;1]) into Pololu pulse width (in us).
	pws[pPololu->rightthrusterchan] = DEFAULT_MID_PW_POLOLU+(int)(urt*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);
	pws[pPololu->leftthrusterchan] = DEFAULT_MID_PW_POLOLU+(int)(ult*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);
	pws[pPololu->rightfluxchan] = DEFAULT_MID_PW_POLOLU+(int)(urf*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);
	pws[pPololu->leftfluxchan] = DEFAULT_MID_PW_POLOLU+(int)(ulf*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);

	pws[pPololu->rudderchan] = max(min(pws[pPololu->rudderchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->rightthrusterchan] = max(min(pws[pPololu->rightthrusterchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->leftthrusterchan] = max(min(pws[pPololu->leftthrusterchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->rightfluxchan] = max(min(pws[pPololu->rightfluxchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->leftfluxchan] = max(min(pws[pPololu->leftfluxchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);

	selectedchannels[pPololu->rudderchan] = 1;
	selectedchannels[pPololu->rightthrusterchan] = 1;
	selectedchannels[pPololu->leftthrusterchan] = 1;
	selectedchannels[pPololu->rightfluxchan] = 1;
	selectedchannels[pPololu->leftfluxchan] = 1;

	return SetAllPWMsPololu(pPololu, selectedchannels, pws);
}